

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_TAGGED_POLICY *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(&target->handle,buffer,size);
  if (target_local._4_4_ == 0) {
    target_local._4_4_ = TPMT_HA_Unmarshal(&target->policyHash,buffer,size,0);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)&(target->handle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_HA_Unmarshal((TPMT_HA *)&(target->policyHash), buffer, size, 0);
    return result;
}